

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaAttributeGroupExpandRefs
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaAttributeGroupPtr_conflict attrGr)

{
  int iVar1;
  xmlSchemaAttributeGroupPtr_conflict attrGr_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  if ((attrGr->attrUses == (void *)0x0) || ((attrGr->flags & 1U) != 0)) {
    pctxt_local._4_4_ = 0;
  }
  else {
    attrGr->flags = attrGr->flags | 1;
    iVar1 = xmlSchemaExpandAttributeGroupRefs
                      (pctxt,(xmlSchemaBasicItemPtr)attrGr,&attrGr->attributeWildcard,
                       (xmlSchemaItemListPtr)attrGr->attrUses,(xmlSchemaItemListPtr)0x0);
    if (iVar1 == -1) {
      pctxt_local._4_4_ = -1;
    }
    else {
      pctxt_local._4_4_ = 0;
    }
  }
  return pctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaAttributeGroupExpandRefs(xmlSchemaParserCtxtPtr pctxt,
				  xmlSchemaAttributeGroupPtr attrGr)
{
    if ((attrGr->attrUses == NULL) ||
	(attrGr->flags & XML_SCHEMAS_ATTRGROUP_WILDCARD_BUILDED))
	return(0);

    attrGr->flags |= XML_SCHEMAS_ATTRGROUP_WILDCARD_BUILDED;
    if (xmlSchemaExpandAttributeGroupRefs(pctxt, WXS_BASIC_CAST attrGr,
	&(attrGr->attributeWildcard), attrGr->attrUses, NULL) == -1)
	return(-1);
    return(0);
}